

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::MultiSelectItemFooter(ImGuiID id,bool *p_selected,bool *p_pressed)

{
  uint uVar1;
  long lVar2;
  ImGuiContext *pIVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  ImGuiBoxSelectState *pIVar9;
  byte *in_RDX;
  byte *in_RSI;
  ImGuiID in_EDI;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool range_selected;
  int range_direction;
  bool request_clear;
  ImGuiInputSource input_source;
  bool enter_pressed;
  bool rect_overlap_prev;
  bool rect_overlap_curr;
  ImGuiBoxSelectState *bs;
  bool apply_to_range_src;
  bool is_shift;
  bool is_ctrl;
  bool is_singleselect;
  ImGuiMultiSelectFlags flags;
  ImGuiSelectionUserData item_data;
  bool hovered;
  ImGuiMultiSelectState *storage;
  ImGuiMultiSelectTempData *ms;
  bool pressed;
  bool selected;
  ImGuiWindow *window;
  ImGuiContext *g;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  ImGuiInputSource local_78;
  bool local_72;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  undefined3 uVar13;
  uint in_stack_ffffffffffffff94;
  uint uVar14;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  byte in_stack_ffffffffffffff9f;
  undefined8 in_stack_ffffffffffffffa0;
  ImGuiID id_00;
  undefined7 in_stack_ffffffffffffffb8;
  byte bVar15;
  ImGuiMultiSelectState *first_item;
  ImGuiMultiSelectTempData *pIVar16;
  undefined6 in_stack_ffffffffffffffd0;
  
  pIVar3 = GImGui;
  bVar4 = *in_RSI & 1;
  bVar5 = *in_RDX & 1;
  pIVar16 = GImGui->CurrentMultiSelect;
  first_item = pIVar16->Storage;
  if (bVar5 != 0) {
    pIVar16->IsFocused = true;
  }
  bVar15 = false;
  if (((pIVar3->LastItemData).StatusFlags & 1U) != 0) {
    bVar15 = IsItemHovered((ImGuiHoveredFlags)in_stack_ffffffffffffffa0);
  }
  id_00 = (ImGuiID)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  if (((pIVar16->IsFocused & 1U) != 0) || ((bool)bVar15 != false)) {
    lVar2 = (pIVar3->NextItemData).SelectionUserData;
    uVar1 = pIVar16->Flags;
    bVar10 = (uVar1 & 1) != 0;
    bVar11 = (pIVar16->KeyMods & 0x1000U) != 0;
    bVar12 = (pIVar16->KeyMods & 0x2000U) != 0;
    bVar6 = false;
    if ((pIVar3->NavId == in_EDI) && (first_item->RangeSrcItem == -1)) {
      bVar6 = true;
    }
    if ((pIVar16->IsEndIO & 1U) == 0) {
      ImVector<ImGuiSelectionRequest>::resize
                ((ImVector<ImGuiSelectionRequest> *)
                 CONCAT17(in_stack_ffffffffffffff87,
                          CONCAT16(in_stack_ffffffffffffff86,
                                   CONCAT15(in_stack_ffffffffffffff85,
                                            CONCAT14(in_stack_ffffffffffffff84,
                                                     in_stack_ffffffffffffff80)))),
                 in_stack_ffffffffffffff7c);
      pIVar16->IsEndIO = true;
    }
    if (pIVar3->NavJustMovedToId == in_EDI) {
      if ((uVar1 & 8) == 0) {
        if ((bVar11) && (bVar12)) {
          bVar5 = 1;
        }
        else if (!bVar11) {
          bVar5 = 1;
          bVar4 = 1;
        }
      }
      else if (bVar12) {
        bVar5 = 1;
      }
      else if (!bVar11) {
        bVar6 = true;
      }
    }
    if (bVar6) {
      first_item->RangeSrcItem = lVar2;
      first_item->RangeSelected = bVar4 & 1;
    }
    bVar7 = bVar4;
    if (pIVar16->BoxSelectId != 0) {
      pIVar9 = GetBoxSelectState(pIVar16->BoxSelectId);
      bVar7 = bVar4;
      if (pIVar9 != (ImGuiBoxSelectState *)0x0) {
        in_stack_ffffffffffffff9f =
             ImRect::Overlaps(&pIVar9->BoxSelectRectCurr,&(pIVar3->LastItemData).Rect);
        in_stack_ffffffffffffff9e =
             ImRect::Overlaps(&pIVar9->BoxSelectRectPrev,&(pIVar3->LastItemData).Rect);
        bVar7 = bVar4;
        if (((((in_stack_ffffffffffffff9f & 1) != 0) && (!(bool)in_stack_ffffffffffffff9e)) &&
            ((bVar4 & 1) == 0)) ||
           (((bool)in_stack_ffffffffffffff9e && ((in_stack_ffffffffffffff9f & 1) == 0)))) {
          if ((first_item->LastSelectionSize < 1) && ((pIVar9->IsStartedSetNavIdOnce & 1U) != 0)) {
            bVar5 = 1;
            pIVar9->IsStartedSetNavIdOnce = false;
          }
          else {
            bVar7 = (bVar4 ^ 0xff) & 1;
            MultiSelectAddSetRange
                      ((ImGuiMultiSelectTempData *)
                       ((CONCAT17(bVar4,CONCAT16(bVar5,in_stack_ffffffffffffffd0)) ^
                        0xff00000000000000) & 0x1ffffffffffffff),SUB81((ulong)pIVar16 >> 0x38,0),
                       (int)pIVar16,(ImGuiSelectionUserData)first_item,
                       CONCAT17(bVar15,in_stack_ffffffffffffffb8));
          }
          iVar8 = ImMax<int>(first_item->LastSelectionSize + 1,1);
          first_item->LastSelectionSize = iVar8;
        }
      }
      id_00 = (ImGuiID)((ulong)pIVar9 >> 0x20);
    }
    if ((((bVar15 & 1) != 0) && (bVar6 = IsMouseClicked(0,false), bVar6)) && ((uVar1 & 8) == 0)) {
      if ((pIVar3->ActiveId != 0) && (pIVar3->ActiveId != in_EDI)) {
        ClearActiveID();
      }
      SetFocusID(id_00,(ImGuiWindow *)
                       CONCAT17(in_stack_ffffffffffffff9f,
                                CONCAT16(in_stack_ffffffffffffff9e,
                                         CONCAT15(in_stack_ffffffffffffff9d,
                                                  CONCAT14(in_stack_ffffffffffffff9c,
                                                           in_stack_ffffffffffffff98)))));
      if (((bVar5 & 1) == 0) && ((bVar7 & 1) == 0)) {
        bVar5 = 1;
        bVar12 = false;
        bVar11 = false;
      }
    }
    local_72 = false;
    if (((bVar5 & 1) != 0) && (local_72 = false, pIVar3->NavActivateId == in_EDI)) {
      local_72 = (pIVar3->NavActivateFlags & 1U) != 0;
    }
    if (((bVar5 & 1) != 0) && ((local_72 == false || ((bVar7 & 1) == 0)))) {
      if ((pIVar3->NavJustMovedToId == in_EDI) || (pIVar3->NavActivateId == in_EDI)) {
        local_78 = pIVar3->NavInputSource;
      }
      else {
        local_78 = ImGuiInputSource_Mouse;
      }
      if ((((((uVar1 & 0xc0) != 0) && ((bVar7 & 1) == 0)) &&
           (((pIVar3->BoxSelectState).IsActive & 1U) == 0)) &&
          ((((pIVar3->BoxSelectState).IsStarting & 1U) == 0 && (local_78 == ImGuiInputSource_Mouse))
          )) && ((pIVar3->IO).MouseClickedCount[0] == 1)) {
        BoxSelectPreStartDrag
                  (id_00,CONCAT17(in_stack_ffffffffffffff9f,
                                  CONCAT16(in_stack_ffffffffffffff9e,
                                           CONCAT15(local_72,CONCAT14(in_stack_ffffffffffffff9c,1)))
                                 ));
      }
      if ((uVar1 & 0x10) == 0) {
        uVar14 = in_stack_ffffffffffffff94 & 0xffffff;
        uVar13 = (undefined3)in_stack_ffffffffffffff94;
        if (bVar10) {
          uVar14 = CONCAT13(1,uVar13);
        }
        else if (((local_78 != ImGuiInputSource_Mouse) && (pIVar3->NavActivateId != in_EDI)) ||
                (bVar11)) {
          if ((((local_78 == ImGuiInputSource_Keyboard) || (local_78 == ImGuiInputSource_Gamepad))
              && (bVar12)) && (!bVar11)) {
            uVar14 = CONCAT13(1,uVar13);
          }
        }
        else {
          if ((uVar1 & 0x20) == 0) {
            bVar4 = 1;
          }
          else {
            bVar4 = bVar7 ^ 0xff;
          }
          uVar14 = CONCAT13(bVar4,uVar13) & 0x1ffffff;
        }
        if ((char)(uVar14 >> 0x18) != '\0') {
          MultiSelectAddSetAll
                    ((ImGuiMultiSelectTempData *)CONCAT44(uVar14,in_stack_ffffffffffffff90),
                     (bool)in_stack_ffffffffffffff8f);
        }
      }
      if ((!bVar12) || (bVar10)) {
        if ((uVar1 & 8) == 0) {
          if (bVar11) {
            bVar7 = bVar7 ^ 0xff;
          }
          else {
            bVar7 = 1;
          }
        }
        else {
          bVar7 = bVar7 ^ 0xff;
        }
        bVar7 = bVar7 & 1;
        first_item->RangeSrcItem = lVar2;
      }
      else if (first_item->RangeSrcItem == -1) {
        first_item->RangeSrcItem = lVar2;
      }
      MultiSelectAddSetRange
                ((ImGuiMultiSelectTempData *)
                 CONCAT17(bVar7,CONCAT16(bVar5,in_stack_ffffffffffffffd0)),
                 SUB81((ulong)pIVar16 >> 0x38,0),(int)pIVar16,(ImGuiSelectionUserData)first_item,
                 CONCAT17(bVar15,in_stack_ffffffffffffffb8));
    }
    if (first_item->RangeSrcItem == lVar2) {
      first_item->RangeSelected = (bVar7 & 1) != 0;
    }
    if (pIVar3->NavId == in_EDI) {
      first_item->NavIdItem = lVar2;
      first_item->NavIdSelected = (bVar7 & 1) != 0;
    }
    if (first_item->NavIdItem == lVar2) {
      pIVar16->NavIdPassedBy = true;
    }
    pIVar16->LastSubmittedItem = lVar2;
    *in_RSI = bVar7 & 1;
    *in_RDX = bVar5 & 1;
  }
  return;
}

Assistant:

void ImGui::MultiSelectItemFooter(ImGuiID id, bool* p_selected, bool* p_pressed)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    bool selected = *p_selected;
    bool pressed = *p_pressed;
    ImGuiMultiSelectTempData* ms = g.CurrentMultiSelect;
    ImGuiMultiSelectState* storage = ms->Storage;
    if (pressed)
        ms->IsFocused = true;

    bool hovered = false;
    if (g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect)
        hovered = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (!ms->IsFocused && !hovered)
        return;

    ImGuiSelectionUserData item_data = g.NextItemData.SelectionUserData;

    ImGuiMultiSelectFlags flags = ms->Flags;
    const bool is_singleselect = (flags & ImGuiMultiSelectFlags_SingleSelect) != 0;
    bool is_ctrl = (ms->KeyMods & ImGuiMod_Ctrl) != 0;
    bool is_shift = (ms->KeyMods & ImGuiMod_Shift) != 0;

    bool apply_to_range_src = false;

    if (g.NavId == id && storage->RangeSrcItem == ImGuiSelectionUserData_Invalid)
        apply_to_range_src = true;
    if (ms->IsEndIO == false)
    {
        ms->IO.Requests.resize(0);
        ms->IsEndIO = true;
    }

    // Auto-select as you navigate a list
    if (g.NavJustMovedToId == id)
    {
        if ((flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
        {
            if (is_ctrl && is_shift)
                pressed = true;
            else if (!is_ctrl)
                selected = pressed = true;
        }
        else
        {
            // With NoAutoSelect, using Shift+keyboard performs a write/copy
            if (is_shift)
                pressed = true;
            else if (!is_ctrl)
                apply_to_range_src = true; // Since if (pressed) {} main block is not running we update this
        }
    }

    if (apply_to_range_src)
    {
        storage->RangeSrcItem = item_data;
        storage->RangeSelected = selected; // Will be updated at the end of this function anyway.
    }

    // Box-select toggle handling
    if (ms->BoxSelectId != 0)
        if (ImGuiBoxSelectState* bs = GetBoxSelectState(ms->BoxSelectId))
        {
            const bool rect_overlap_curr = bs->BoxSelectRectCurr.Overlaps(g.LastItemData.Rect);
            const bool rect_overlap_prev = bs->BoxSelectRectPrev.Overlaps(g.LastItemData.Rect);
            if ((rect_overlap_curr && !rect_overlap_prev && !selected) || (rect_overlap_prev && !rect_overlap_curr))
            {
                if (storage->LastSelectionSize <= 0 && bs->IsStartedSetNavIdOnce)
                {
                    pressed = true; // First item act as a pressed: code below will emit selection request and set NavId (whatever we emit here will be overridden anyway)
                    bs->IsStartedSetNavIdOnce = false;
                }
                else
                {
                    selected = !selected;
                    MultiSelectAddSetRange(ms, selected, +1, item_data, item_data);
                }
                storage->LastSelectionSize = ImMax(storage->LastSelectionSize + 1, 1);
            }
        }

    // Right-click handling.
    // FIXME-MULTISELECT: Currently filtered out by ImGuiMultiSelectFlags_NoAutoSelect but maybe should be moved to Selectable(). See https://github.com/ocornut/imgui/pull/5816
    if (hovered && IsMouseClicked(1) && (flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
    {
        if (g.ActiveId != 0 && g.ActiveId != id)
            ClearActiveID();
        SetFocusID(id, window);
        if (!pressed && !selected)
        {
            pressed = true;
            is_ctrl = is_shift = false;
        }
    }

    // Unlike Space, Enter doesn't alter selection (but can still return a press) unless current item is not selected.
    // The later, "unless current item is not select", may become optional? It seems like a better default if Enter doesn't necessarily open something
    // (unlike e.g. Windows explorer). For use case where Enter always open something, we might decide to make this optional?
    const bool enter_pressed = pressed && (g.NavActivateId == id) && (g.NavActivateFlags & ImGuiActivateFlags_PreferInput);

    // Alter selection
    if (pressed && (!enter_pressed || !selected))
    {
        // Box-select
        ImGuiInputSource input_source = (g.NavJustMovedToId == id || g.NavActivateId == id) ? g.NavInputSource : ImGuiInputSource_Mouse;
        if (flags & (ImGuiMultiSelectFlags_BoxSelect1d | ImGuiMultiSelectFlags_BoxSelect2d))
            if (selected == false && !g.BoxSelectState.IsActive && !g.BoxSelectState.IsStarting && input_source == ImGuiInputSource_Mouse && g.IO.MouseClickedCount[0] == 1)
                BoxSelectPreStartDrag(ms->BoxSelectId, item_data);

        //----------------------------------------------------------------------------------------
        // ACTION                      | Begin  | Pressed/Activated  | End
        //----------------------------------------------------------------------------------------
        // Keys Navigated:             | Clear  | Src=item, Sel=1               SetRange 1
        // Keys Navigated: Ctrl        | n/a    | n/a
        // Keys Navigated:      Shift  | n/a    | Dst=item, Sel=1,   => Clear + SetRange 1
        // Keys Navigated: Ctrl+Shift  | n/a    | Dst=item, Sel=Src  => Clear + SetRange Src-Dst
        // Keys Activated:             | n/a    | Src=item, Sel=1    => Clear + SetRange 1
        // Keys Activated: Ctrl        | n/a    | Src=item, Sel=!Sel =>         SetSange 1
        // Keys Activated:      Shift  | n/a    | Dst=item, Sel=1    => Clear + SetSange 1
        //----------------------------------------------------------------------------------------
        // Mouse Pressed:              | n/a    | Src=item, Sel=1,   => Clear + SetRange 1
        // Mouse Pressed:  Ctrl        | n/a    | Src=item, Sel=!Sel =>         SetRange 1
        // Mouse Pressed:       Shift  | n/a    | Dst=item, Sel=1,   => Clear + SetRange 1
        // Mouse Pressed:  Ctrl+Shift  | n/a    | Dst=item, Sel=!Sel =>         SetRange Src-Dst
        //----------------------------------------------------------------------------------------

        if ((flags & ImGuiMultiSelectFlags_NoAutoClear) == 0)
        {
            bool request_clear = false;
            if (is_singleselect)
                request_clear = true;
            else if ((input_source == ImGuiInputSource_Mouse || g.NavActivateId == id) && !is_ctrl)
                request_clear = (flags & ImGuiMultiSelectFlags_NoAutoClearOnReselect) ? !selected : true;
            else if ((input_source == ImGuiInputSource_Keyboard || input_source == ImGuiInputSource_Gamepad) && is_shift && !is_ctrl)
                request_clear = true; // With is_shift==false the RequestClear was done in BeginIO, not necessary to do again.
            if (request_clear)
                MultiSelectAddSetAll(ms, false);
        }

        int range_direction;
        bool range_selected;
        if (is_shift && !is_singleselect)
        {
            //IM_ASSERT(storage->HasRangeSrc && storage->HasRangeValue);
            if (storage->RangeSrcItem == ImGuiSelectionUserData_Invalid)
                storage->RangeSrcItem = item_data;
            if ((flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
            {
                // Shift+Arrow always select
                // Ctrl+Shift+Arrow copy source selection state (already stored by BeginMultiSelect() in storage->RangeSelected)
                range_selected = (is_ctrl && storage->RangeSelected != -1) ? (storage->RangeSelected != 0) : true;
            }
            else
            {
                // Shift+Arrow copy source selection state
                // Shift+Click always copy from target selection state
                if (ms->IsKeyboardSetRange)
                    range_selected = (storage->RangeSelected != -1) ? (storage->RangeSelected != 0) : true;
                else
                    range_selected = !selected;
            }
            range_direction = ms->RangeSrcPassedBy ? +1 : -1;
        }
        else
        {
            // Ctrl inverts selection, otherwise always select
            if ((flags & ImGuiMultiSelectFlags_NoAutoSelect) == 0)
                selected = is_ctrl ? !selected : true;
            else
                selected = !selected;
            storage->RangeSrcItem = item_data;
            range_selected = selected;
            range_direction = +1;
        }
        MultiSelectAddSetRange(ms, range_selected, range_direction, storage->RangeSrcItem, item_data);
    }

    // Update/store the selection state of the Source item (used by CTRL+SHIFT, when Source is unselected we perform a range unselect)
    if (storage->RangeSrcItem == item_data)
        storage->RangeSelected = selected ? 1 : 0;

    // Update/store the selection state of focused item
    if (g.NavId == id)
    {
        storage->NavIdItem = item_data;
        storage->NavIdSelected = selected ? 1 : 0;
    }
    if (storage->NavIdItem == item_data)
        ms->NavIdPassedBy = true;
    ms->LastSubmittedItem = item_data;

    *p_selected = selected;
    *p_pressed = pressed;
}